

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O0

uint64_t jessilib::text_hash::hash<char>(char *data,char *end)

{
  decode_result dVar1;
  undefined4 uStack_44;
  undefined1 local_38 [8];
  decode_result decode;
  uint64_t hash;
  char *end_local;
  char *data_local;
  
  decode.units = 0xcbf29ce484222325;
  decode_result::decode_result((decode_result *)local_38);
  end_local = data;
  while( true ) {
    if (end_local == end) {
      return decode.units;
    }
    dVar1 = decode_codepoint<char>(end_local,end);
    decode._0_8_ = dVar1.units;
    local_38._4_4_ = uStack_44;
    local_38._0_4_ = dVar1.codepoint;
    if (decode._0_8_ == 0) break;
    decode.units = (decode.units ^ (uint)dVar1.codepoint) * 0x100000001b3;
    end_local = end_local + decode._0_8_;
  }
  return decode.units;
}

Assistant:

static uint64_t hash(const CharT* data, const CharT* end) {
		uint64_t hash = 14695981039346656037ULL;

		decode_result decode;
		while (data != end) {
			decode = decode_codepoint(data, end);
			if (decode.units == 0) {
				return hash;
			}

			hash = hash ^ decode.codepoint;
			hash = hash * 1099511628211ULL;
			data += decode.units;
		}

		return hash;
	}